

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_ghost_hearing(parser *p)

{
  long *plVar1;
  wchar_t wVar2;
  void *pvVar3;
  long *plVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    plVar1 = *(long **)((long)pvVar3 + 0x18);
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while (plVar1 != (long *)0x0);
    wVar2 = parser_getint(p,"hearing");
    *(int *)((long)plVar4 + 0x14) = (wVar2 * 0x14) / (int)(uint)z_info->max_sight;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x7c9,"enum parser_error parse_ghost_hearing(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_hearing(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->hearing = parser_getint(p, "hearing") * 20 / z_info->max_sight;
	return PARSE_ERROR_NONE;
}